

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int HUF_validateCTable(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = false;
  for (lVar2 = 0; lVar2 <= (int)maxSymbolValue; lVar2 = lVar2 + 1) {
    bVar1 = (bool)(bVar1 | ((char)CTable[lVar2 + 1] == '\0' && count[lVar2] != 0));
  }
  return (int)!bVar1;
}

Assistant:

int HUF_validateCTable(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue) {
  HUF_CElt const* ct = CTable + 1;
  int bad = 0;
  int s;
  for (s = 0; s <= (int)maxSymbolValue; ++s) {
    bad |= (count[s] != 0) & (HUF_getNbBits(ct[s]) == 0);
  }
  return !bad;
}